

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

bool cfd::core::Pubkey::IsValid(ByteData *byte_data)

{
  byte bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  __return_storage_ptr__ = &local_20;
  ByteData::GetBytes(__return_storage_ptr__,byte_data);
  if (local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar1 = *local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((bVar1 & 0xfe) == 2) {
      bVar2 = (long)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start == 0x21;
LAB_00443e03:
      __return_storage_ptr__ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)bVar2
      ;
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if ((bVar1 < 8) && ((0xd0U >> (bVar1 & 0x1f) & 1) != 0)) {
        bVar2 = (long)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0x41;
        goto LAB_00443e03;
      }
    }
    bVar1 = (byte)__return_storage_ptr__;
    if (!bVar2) goto LAB_00443e0e;
  }
  bVar1 = 0;
LAB_00443e0e:
  if (local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool Pubkey::IsValid(const ByteData &byte_data) {
  const std::vector<uint8_t> &buffer = byte_data.GetBytes();
  if (buffer.size() > 0) {
    uint8_t header = buffer[0];
    if (header == 0x02 || header == 0x03) {
      return buffer.size() == Pubkey::kCompressedPubkeySize;
    } else if (header == 0x04 || header == 0x06 || header == 0x07) {
      return buffer.size() == Pubkey::kPubkeySize;
    }
  }
  return false;
}